

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Select.hpp
# Opt level: O2

Gen<char> * __thiscall
rc::gen::oneOf<char,char>
          (Gen<char> *__return_storage_ptr__,gen *this,Gen<char> *gen,Gen<char> *gens)

{
  OneOfGen<char> OStack_88;
  Gen<char> local_70;
  Gen<char> local_48;
  
  Gen<char>::Gen(&local_48,(Gen<char> *)this);
  Gen<char>::Gen(&local_70,gen);
  detail::OneOfGen<char>::OneOfGen<char,char>(&OStack_88,&local_48,&local_70);
  Gen<char>::Gen<rc::gen::detail::OneOfGen<char>,void>(__return_storage_ptr__,&OStack_88);
  std::vector<rc::Gen<char>,_std::allocator<rc::Gen<char>_>_>::~vector(&OStack_88.m_gens);
  Gen<char>::~Gen(&local_70);
  Gen<char>::~Gen(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Gen<T> oneOf(Gen<T> gen, Gen<Ts>... gens) {
  return detail::OneOfGen<T>(std::move(gen), std::move(gens)...);
}